

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

ostream * std::operator<<(ostream *stream,view_type *value)

{
  const_pointer pvVar1;
  undefined8 in_RAX;
  value_type *item;
  const_pointer pvVar2;
  undefined8 uStack_28;
  
  pvVar2 = value->head;
  pvVar1 = value->tail;
  if (pvVar2 != pvVar1) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT17(*pvVar2,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)((long)&uStack_28 + 7),1);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar1);
  }
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream,
                          const decoder_type::view_type& value)
{
    for (auto&& item : value)
    {
        stream << item;
    }
    return stream;
}